

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

double GetUDMFFloat(int type,int index,char *key)

{
  FUDMFKeys *this;
  FUDMFKey *pFVar1;
  double dVar2;
  FName local_1c;
  
  if ((uint)type < 4) {
    this = TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::CheckKey
                     (UDMFKeys + (uint)type,index);
    dVar2 = 0.0;
    if (this != (FUDMFKeys *)0x0) {
      FName::FName(&local_1c,key);
      pFVar1 = FUDMFKeys::Find(this,&local_1c);
      dVar2 = 0.0;
      if (pFVar1 != (FUDMFKey *)0x0) {
        dVar2 = pFVar1->FloatVal;
      }
    }
    return dVar2;
  }
  __assert_fail("type >=0 && type <=3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_udmf.cpp"
                ,0x16b,"double GetUDMFFloat(int, int, const char *)");
}

Assistant:

double GetUDMFFloat(int type, int index, const char *key)
{
	assert(type >=0 && type <=3);

	FUDMFKeys *pKeys = UDMFKeys[type].CheckKey(index);

	if (pKeys != NULL)
	{
		FUDMFKey *pKey = pKeys->Find(key);
		if (pKey != NULL)
		{
			return pKey->FloatVal;
		}
	}
	return 0;
}